

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDefs.cpp
# Opt level: O3

void de::throwRuntimeError(char *message,char *expr,char *file,int line)

{
  size_t sVar1;
  ostream *poVar2;
  runtime_error *this;
  char *__s;
  ostringstream msg;
  string local_1c8 [32];
  long local_1a8 [47];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = "Runtime check failed";
  if (message != (char *)0x0) {
    __s = message;
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": ",2);
  if (expr != (char *)0x0) {
    local_1c8[0] = (string)0x27;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1c8,1);
    sVar1 = strlen(expr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,expr,sVar1);
    local_1c8[0] = (string)0x27;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1c8,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at ",4);
  if (file == (char *)0x0) {
    std::ios::clear((int)local_1c8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x20);
  }
  else {
    sVar1 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,file,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
  std::ostream::operator<<(local_1a8,line);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwRuntimeError (const char* message, const char* expr, const char* file, int line)
{
	std::ostringstream msg;
	msg << (message ? message : "Runtime check failed") << ": ";
	if (expr)
		msg << '\'' << expr << '\'';
	msg << " at " << file << ":" << line;
	throw std::runtime_error(msg.str());
}